

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

void absl::lts_20250127::cord_internal::anon_unknown_0::DeleteLeafEdge(CordRep *rep)

{
  bool bVar1;
  CordRep *rep_00;
  CordRepExternal *rep_01;
  CordRepSubstring *substring;
  CordRep *rep_local;
  
  bVar1 = IsDataEdge(rep);
  if (bVar1) {
    if (rep->tag < 6) {
      if (rep->tag == '\x05') {
        rep_01 = CordRep::external(rep);
        CordRepExternal::Delete(&rep_01->super_CordRep);
      }
      else {
        substring = CordRep::substring(rep);
        DeleteSubstring(substring);
      }
    }
    else {
      rep_00 = &CordRep::flat(rep)->super_CordRep;
      CordRepFlat::Delete(rep_00);
    }
    return;
  }
  __assert_fail("IsDataEdge(rep)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                ,0xd8,"void absl::cord_internal::(anonymous namespace)::DeleteLeafEdge(CordRep *)");
}

Assistant:

void DeleteLeafEdge(CordRep* rep) {
  assert(IsDataEdge(rep));
  if (rep->tag >= FLAT) {
    CordRepFlat::Delete(rep->flat());
  } else if (rep->tag == EXTERNAL) {
    CordRepExternal::Delete(rep->external());
  } else {
    DeleteSubstring(rep->substring());
  }
}